

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

void __thiscall SQVM::Remove(SQVM *this,SQInteger n)

{
  SQUnsignedInteger *pSVar1;
  SQObjectPtr *pSVar2;
  SQObjectType SVar3;
  SQObjectPtr *pSVar4;
  SQObjectPtr *pSVar5;
  SQTable *pSVar6;
  SQFloat SVar7;
  undefined4 uVar8;
  SQObjectFlags SVar9;
  undefined3 uVar10;
  ulong uVar11;
  ulong uVar12;
  
  if (n < 0) {
    uVar12 = n + this->_top;
  }
  else {
    uVar12 = (n + this->_stackbase) - 1;
  }
  while ((long)uVar12 < this->_top) {
    uVar11 = uVar12 & 0xffffffff;
    uVar12 = uVar12 + 1;
    pSVar4 = (this->_stack)._vals;
    SVar3 = pSVar4[uVar11].super_SQObject._type;
    pSVar6 = pSVar4[uVar11].super_SQObject._unVal.pTable;
    pSVar2 = pSVar4 + (uVar12 & 0xffffffff);
    SVar9 = (pSVar2->super_SQObject)._flags;
    uVar10 = *(undefined3 *)&(pSVar2->super_SQObject).field_0x5;
    SVar7 = (pSVar2->super_SQObject)._unVal.fFloat;
    uVar8 = *(undefined4 *)((long)&(pSVar2->super_SQObject)._unVal + 4);
    pSVar5 = pSVar4 + uVar11;
    (pSVar5->super_SQObject)._type = (pSVar2->super_SQObject)._type;
    (pSVar5->super_SQObject)._flags = SVar9;
    *(undefined3 *)&(pSVar5->super_SQObject).field_0x5 = uVar10;
    (pSVar5->super_SQObject)._unVal.fFloat = SVar7;
    *(undefined4 *)((long)&(pSVar5->super_SQObject)._unVal + 4) = uVar8;
    if ((pSVar4[uVar11].super_SQObject._type & 0x8000000) != 0) {
      pSVar1 = &((pSVar4[uVar11].super_SQObject._unVal.pTable)->super_SQDelegable).
                super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  pSVar5 = (this->_stack)._vals;
  uVar12 = this->_top & 0xffffffff;
  pSVar6 = pSVar5[uVar12].super_SQObject._unVal.pTable;
  SVar3 = pSVar5[uVar12].super_SQObject._type;
  pSVar2 = pSVar5 + uVar12;
  (pSVar2->super_SQObject)._type = 0;
  (pSVar2->super_SQObject)._flags = '\0';
  *(undefined3 *)&(pSVar2->super_SQObject).field_0x5 = 0;
  (pSVar2->super_SQObject)._unVal.pTable = (SQTable *)0x0;
  pSVar5[uVar12].super_SQObject._type = OT_NULL;
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
  }
  this->_top = this->_top + -1;
  return;
}

Assistant:

void SQVM::Remove(SQInteger n) {
    n = (n >= 0)?n + _stackbase - 1:_top + n;
    for(SQInteger i = n; i < _top; i++){
        _stack[i] = _stack[i+1];
    }
    _stack[_top].Null();
    _top--;
}